

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

uint64_t icu_63::util64_pow(uint32_t base,uint16_t exponent)

{
  ulong uVar1;
  ulong uVar3;
  ulong uVar4;
  ulong uVar2;
  
  uVar4 = (ulong)exponent;
  if (base == 0) {
    uVar1 = 0;
  }
  else {
    uVar3 = (ulong)base;
    uVar1 = 1;
    while( true ) {
      uVar2 = uVar3;
      if ((uVar4 & 1) == 0) {
        uVar2 = 1;
      }
      uVar1 = uVar2 * uVar1;
      if ((ushort)uVar4 < 2) break;
      uVar4 = uVar4 >> 1;
      uVar3 = uVar3 * uVar3;
    }
  }
  return uVar1;
}

Assistant:

uint64_t util64_pow(uint32_t base, uint16_t exponent)  {
    if (base == 0) {
        return 0;
    }
    uint64_t result = 1;
    uint64_t pow = base;
    while (true) {
        if ((exponent & 1) == 1) {
            result *= pow;
        }
        exponent >>= 1;
        if (exponent == 0) {
            break;
        }
        pow *= pow;
    }
    return result;
}